

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluStrUtil.cpp
# Opt level: O1

ostream * eglu::operator<<(ostream *str,ContextAttribListFmt *fmt)

{
  uint uVar1;
  bool bVar2;
  ContextAttribValueFmt in_RAX;
  ostream *poVar3;
  size_t sVar4;
  long lVar5;
  ContextAttribValueFmt CVar6;
  int iVar7;
  char *pcVar8;
  ContextAttribValueFmt local_38;
  
  local_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(str,"{ ",2);
  iVar7 = 0;
  do {
    uVar1 = fmt->attribs[iVar7];
    CVar6.value = 0;
    CVar6.attribute = uVar1;
    if (iVar7 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
    }
    if ((int)uVar1 < 0x3086) {
      if (uVar1 == 0x3028) {
        bVar2 = false;
        pcVar8 = "EGL_CONFIG_ID";
        goto LAB_00ea8d0a;
      }
      if (uVar1 != 0x3038) {
LAB_00ea8d05:
        bVar2 = true;
        pcVar8 = (char *)0x0;
        goto LAB_00ea8d0a;
      }
      lVar5 = 8;
      pcVar8 = "EGL_NONE";
      poVar3 = str;
LAB_00ea8d2c:
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar8,lVar5);
      bVar2 = false;
    }
    else {
      if (uVar1 == 0x3086) {
        bVar2 = false;
        pcVar8 = "EGL_RENDER_BUFFER";
      }
      else if (uVar1 == 0x3097) {
        bVar2 = false;
        pcVar8 = "EGL_CONTEXT_CLIENT_TYPE";
      }
      else {
        if (uVar1 != 0x3098) goto LAB_00ea8d05;
        bVar2 = false;
        pcVar8 = "EGL_CONTEXT_CLIENT_VERSION";
      }
LAB_00ea8d0a:
      if (bVar2) {
        local_38 = CVar6;
        poVar3 = tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_38,str);
        lVar5 = 5;
        pcVar8 = ", ???";
        goto LAB_00ea8d2c;
      }
      sVar4 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>(str,pcVar8,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
      local_38.value = fmt->attribs[iVar7 + 1];
      local_38.attribute = uVar1;
      operator<<(str,&local_38);
      iVar7 = iVar7 + 2;
      bVar2 = true;
    }
    if (!bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>(str," }",2);
      return str;
    }
  } while( true );
}

Assistant:

std::ostream& operator<< (std::ostream& str, const ContextAttribListFmt& fmt)
{
	int pos = 0;

	str << "{ ";

	for (;;)
	{
		int attrib = fmt.attribs[pos];

		if (pos != 0)
			str << ", ";

		if (attrib == EGL_NONE)
		{
			// Terminate.
			str << "EGL_NONE";
			break;
		}

		const char*	attribName = getContextAttribName(attrib);

		if (attribName)
		{
			// Valid attribute, print value.
			str << attribName << ", " << getContextAttribValueStr(attrib, fmt.attribs[pos+1]);
			pos += 2;
		}
		else
		{
			// Invalid attribute. Terminate parsing.
			str << tcu::toHex(attrib) << ", ???";
			break;
		}
	}

	str << " }";
	return str;
}